

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O1

void __thiscall Kumu::StdioLogSink::WriteEntry(StdioLogSink *this,LogEntry *Entry)

{
  Mutex *__mutex;
  bool bVar1;
  string buf;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  __mutex = &(this->super_ILogSink).m_lock;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  ILogSink::WriteEntryToListeners(&this->super_ILogSink,Entry);
  bVar1 = LogEntry::TestFilter(Entry,(this->super_ILogSink).m_filter);
  if (bVar1) {
    LogEntry::CreateStringWithOptions(Entry,&local_40,(this->super_ILogSink).m_options);
    fputs(local_40._M_dataplus._M_p,(FILE *)this->m_stream);
    fflush((FILE *)this->m_stream);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
Kumu::StdioLogSink::WriteEntry(const LogEntry& Entry)
{
  std::string buf;
  AutoMutex L(m_lock);
  WriteEntryToListeners(Entry);

  if ( Entry.TestFilter(m_filter) )
    {
      Entry.CreateStringWithOptions(buf, m_options);
      fputs(buf.c_str(), m_stream);
      fflush(m_stream);
    }
}